

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

uint8_t * uprv_eastrncpy_63(uint8_t *dst,uint8_t *src,int32_t n)

{
  size_t sVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  
  if (n == -1) {
    sVar1 = strlen((char *)src);
    n = (int)sVar1 + 1;
  }
  lVar2 = 0;
  for (; ((ulong)src[lVar2] != 0 && (0 < n)); n = n + -1) {
    uVar4 = 'o';
    if (""[src[lVar2]] != '\0') {
      uVar4 = ""[src[lVar2]];
    }
    dst[lVar2] = uVar4;
    lVar2 = lVar2 + 1;
  }
  puVar3 = dst + lVar2;
  for (; 0 < n; n = n + -1) {
    *puVar3 = '\0';
    puVar3 = puVar3 + 1;
  }
  return dst;
}

Assistant:

U_INTERNAL uint8_t* U_EXPORT2
uprv_eastrncpy(uint8_t *dst, const uint8_t *src, int32_t n)
{
  uint8_t *orig_dst = dst;

  if(n==-1) { 
    n = static_cast<int32_t>(uprv_strlen((const char*)src)+1); /* copy NUL */
  }
  /* copy non-null */
  while(*src && n>0) {
    char ch = ebcdicFromAscii[*(src++)];
    if(ch == 0) {
      ch = ebcdicFromAscii[0x3f]; /* questionmark (subchar) */
    }
    *(dst++) = ch;
    n--;
  }
  /* pad */
  while(n>0) {
    *(dst++) = 0;
    n--;
  }
  return orig_dst;
}